

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

bool slang::ast::canConnectToRefArg
               (ASTContext *context,Expression *expr,bitmask<slang::ast::VariableFlags> argFlags,
               bool allowConstClassHandle,bool disallowDynamicArrays)

{
  ExpressionKind EVar1;
  bool bVar2;
  uint uVar3;
  Symbol *pSVar4;
  Type *this;
  Type *pTVar5;
  long lVar6;
  uint uVar7;
  
  uVar7 = (uint)allowConstClassHandle;
  pSVar4 = Expression::getSymbolReference((Expression *)context,false);
  if (pSVar4 != (Symbol *)0x0) {
    do {
      uVar3 = pSVar4->kind - Variable;
      if (0x18 < uVar3) {
        return false;
      }
      if ((0x1800c0fU >> (uVar3 & 0x1f) & 1) == 0) {
        return false;
      }
      if ((((ulong)expr & 1) == 0) && (((ulong)pSVar4[5].name._M_str & 0x100000000) != 0)) {
        if ((argFlags.m_bits & 1) == 0) {
          return false;
        }
        this = DeclaredType::getType((DeclaredType *)(pSVar4 + 1));
        pTVar5 = this->canonical;
        if (pTVar5 == (Type *)0x0) {
          Type::resolveCanonical(this);
          pTVar5 = this->canonical;
        }
        if ((pTVar5->super_Symbol).kind != ClassType) {
          return false;
        }
      }
      if (((ulong)expr & 0x20) != 0) {
        if ((*(int *)&pSVar4[5].name._M_str == 0) &&
           (((ulong)pSVar4[5].name._M_str & 0x2000000000) == 0)) {
          return false;
        }
        if ((uVar7 & 1) != 0) {
          pTVar5 = DeclaredType::getType((DeclaredType *)(pSVar4 + 1));
          bVar2 = Type::isDynamicallySizedArray(pTVar5);
          if (bVar2) {
            return false;
          }
        }
      }
      EVar1 = *(ExpressionKind *)&(context->scope).ptr;
      if (EVar1 - ElementSelect < 2) {
        lVar6 = 0x30;
        argFlags.m_bits = 0;
        uVar7 = ((uint)expr & 0x20) >> 5;
      }
      else {
        if (EVar1 != MemberAccess) {
          return true;
        }
        argFlags.m_bits = 1;
        lVar6 = 0x38;
        uVar7 = 0;
      }
      context = *(ASTContext **)((long)&(context->scope).ptr + lVar6);
      pSVar4 = Expression::getSymbolReference((Expression *)context,false);
    } while (pSVar4 != (Symbol *)0x0);
  }
  return false;
}

Assistant:

static bool canConnectToRefArg(const ASTContext& context, const Expression& expr,
                               bitmask<VariableFlags> argFlags, bool allowConstClassHandle = false,
                               bool disallowDynamicArrays = false) {
    auto sym = expr.getSymbolReference(/* allowPacked */ false);
    if (!sym || !VariableSymbol::isKind(sym->kind))
        return false;

    auto& var = sym->as<VariableSymbol>();
    if (!argFlags.has(VariableFlags::Const) && var.flags.has(VariableFlags::Const) &&
        (!allowConstClassHandle || !var.getType().isClass())) {
        return false;
    }

    const bool isRefStatic = argFlags.has(VariableFlags::RefStatic);
    if (isRefStatic) {
        if (var.lifetime == VariableLifetime::Automatic &&
            !var.flags.has(VariableFlags::RefStatic)) {
            return false;
        }

        if (disallowDynamicArrays && var.getType().isDynamicallySizedArray())
            return false;
    }

    // Need to recursively check the left hand side of element selects and member accesses
    // to be sure this is actually an lvalue and not, for example, the result of a
    // function call or something.
    switch (expr.kind) {
        case ExpressionKind::ElementSelect:
            return canConnectToRefArg(context, expr.as<ElementSelectExpression>().value(), argFlags,
                                      false, isRefStatic);
        case ExpressionKind::RangeSelect:
            return canConnectToRefArg(context, expr.as<RangeSelectExpression>().value(), argFlags,
                                      false, isRefStatic);
        case ExpressionKind::MemberAccess:
            return canConnectToRefArg(context, expr.as<MemberAccessExpression>().value(), argFlags,
                                      true);
        default:
            return true;
    }
}